

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmundo.cpp
# Opt level: O0

void __thiscall CVmUndo::gc_mark_refs(CVmUndo *this)

{
  CVmUndoRecord *in_RDI;
  CVmUndoMeta *next_link;
  CVmUndoMeta *cur;
  CVmObjGlobPage *pCVar1;
  CVmObjGlobPage *this_00;
  
  if ((in_RDI->oldval).val.ptr != (void *)0x0) {
    pCVar1 = (CVmObjGlobPage *)(in_RDI->oldval).val.ptr;
    this_00 = (CVmObjGlobPage *)(in_RDI->oldval).val.native_desc;
    do {
      if (this_00 == pCVar1) {
        pCVar1 = (CVmObjGlobPage *)this_00->used_;
      }
      else if (*(int *)&this_00->nxt_ != 0) {
        CVmObjTable::mark_obj_undo_rec
                  ((CVmObjTable *)this_00,(vm_obj_id_t)((ulong)pCVar1 >> 0x20),in_RDI);
      }
      this_00 = (CVmObjGlobPage *)&((CVmObjTable *)this_00)->page_slots_;
      if (this_00 ==
          (CVmObjGlobPage *)((long)in_RDI[1].id.ptrval + *(long *)&in_RDI[1].oldval * 0x20)) {
        this_00 = (CVmObjGlobPage *)in_RDI[1].id.ptrval;
      }
    } while (this_00 != *(CVmObjGlobPage **)(in_RDI + 1));
  }
  return;
}

Assistant:

void CVmUndo::gc_mark_refs(VMG0_)
{
    CVmUndoMeta *cur;
    CVmUndoMeta *next_link;

    /* if we don't have any records, there's nothing to do */
    if (oldest_first_ == 0)
        return;

    /* the first record is a linking record */
    next_link = oldest_first_;

    /* start at the first record */
    cur = oldest_first_;

    /* 
     *   Go through all undo records, from the oldest to the newest.  Note
     *   that we must keep track of each "link" record, because these are
     *   not ordinary undo records and must be handled differently.  
     */
    for (;;)
    {
        /* check to see if this is a linking record or an ordinary record */
        if (cur == next_link)
        {
            /* 
             *   this is a linking record - simply note the next linking
             *   record and otherwise ignore this record 
             */
            next_link = cur->link.next_first;
        }
        else if (cur->rec.obj != VM_INVALID_OBJ)
        {
            /* 
             *   It's an ordinary undo record -- mark its references.
             *   Note that the fact that an object has undo records does
             *   not mean that the object is reachable -- this is
             *   effectively a weak link to the object, because if it's
             *   not reachable through other means, there's no need to
             *   keep any undo information for it; so, we don't mark the
             *   owner object itself as reachable at this point.  
             */
            G_obj_table->mark_obj_undo_rec(vmg_ cur->rec.obj, &cur->rec);
        }
        
        /* advance to the next record, wrapping at the end of the array */
        ++cur;
        if (cur == rec_arr_ + rec_arr_size_)
            cur = rec_arr_;

        /* stop if we've reached the last record */
        if (cur == next_free_)
            break;
    }
}